

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  ushort in_SI;
  undefined8 uVar2;
  u32 *in_RDI;
  u32 result;
  u32 data;
  u32 ea;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = readOp<(moira::Mode)6,(moira::Size)4,128ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),in_stack_ffffffffffffffe4,in_RDI,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    iVar4 = in_stack_ffffffffffffffe4;
    readD<(moira::Size)4>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffe4),
               in_stack_ffffffffffffffcc);
    logic<(moira::Instr)9,(moira::Size)4>
              ((Moira *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),(u32)((ulong)in_RDI >> 0x20),
               (u32)in_RDI);
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffe4));
    bVar1 = isRegMode(MODE_IX);
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
    if (!bVar1) {
      bVar1 = isImmMode(MODE_IX);
      uVar3 = CONCAT13(bVar1,(int3)uVar3);
    }
    uVar2 = 2;
    if ((char)((uint)uVar3 >> 0x18) != '\0') {
      uVar2 = 4;
    }
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,uVar2);
    writeD<(moira::Size)4>
              ((Moira *)CONCAT44(uVar3,in_stack_ffffffffffffffe4),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}